

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void assign_area_vnum(int vnum)

{
  short sVar1;
  int local_10;
  int local_c;
  int vnum_local;
  
  sVar1 = (short)vnum;
  if ((area_last->min_vnum == 0) || (area_last->max_vnum == 0)) {
    area_last->max_vnum = sVar1;
    area_last->min_vnum = sVar1;
  }
  if (vnum < area_last->min_vnum) {
    local_c = (int)area_last->min_vnum;
  }
  else {
    local_10 = vnum;
    if (area_last->max_vnum < vnum) {
      local_10 = (int)area_last->max_vnum;
    }
    local_c = local_10;
  }
  if (vnum != local_c) {
    if (vnum < area_last->min_vnum) {
      area_last->min_vnum = sVar1;
    }
    else {
      area_last->max_vnum = sVar1;
    }
  }
  return;
}

Assistant:

void assign_area_vnum(int vnum)
{
	if (area_last->min_vnum == 0 || area_last->max_vnum == 0)
		area_last->min_vnum = area_last->max_vnum = vnum;

	if (vnum != URANGE(area_last->min_vnum, vnum, area_last->max_vnum))
	{
		if (vnum < area_last->min_vnum)
			area_last->min_vnum = vnum;
		else
			area_last->max_vnum = vnum;
	}
}